

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

bool ImGui::TestKeyOwner(ImGuiKey key,ImGuiID owner_id)

{
  ImGuiID IVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (0x8b < key - ImGuiKey_NamedKey_BEGIN) {
    uVar2 = key - ImGuiKey_ModCtrl >> 0xc;
    if (7 < (key << 0x14 | uVar2)) {
      return true;
    }
    if ((0x8bU >> (uVar2 & 0x1f) & 1) == 0) {
      return true;
    }
  }
  if ((((GImGui->ActiveIdUsingAllKeyboardKeys != true) || (0x68 < key - ImGuiKey_NamedKey_BEGIN)) ||
      (owner_id == 0)) || (GImGui->ActiveId == owner_id)) {
    if ((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
      uVar2 = key - ImGuiKey_ModCtrl >> 0xc;
      uVar3 = key << 0x14 | uVar2;
      if ((uVar3 < 8) && ((0x8bU >> (uVar2 & 0x1f) & 1) != 0)) {
        key = *(ImGuiKey *)(&DAT_0025af80 + (ulong)uVar3 * 4);
      }
    }
    iVar4 = key - ImGuiKey_NamedKey_BEGIN;
    if (owner_id == 0) {
      return GImGui->KeysOwnerData[iVar4].LockThisFrame == false;
    }
    IVar1 = GImGui->KeysOwnerData[iVar4].OwnerCurr;
    if ((IVar1 == owner_id) ||
       ((IVar1 == 0xffffffff && (GImGui->KeysOwnerData[iVar4].LockThisFrame == false)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline bool             IsNamedKeyOrModKey(ImGuiKey key)                            { return (key >= ImGuiKey_NamedKey_BEGIN && key < ImGuiKey_NamedKey_END) || key == ImGuiMod_Ctrl || key == ImGuiMod_Shift || key == ImGuiMod_Alt || key == ImGuiMod_Super; }